

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void internal_counters_gga_prev
               (xc_dimensions *dim,int offset,double **rho,double **sigma,double **zk,double **vrho,
               double **vsigma,double **v2rho2,double **v2rhosigma,double **v2sigma2,double **v3rho3
               ,double **v3rho2sigma,double **v3rhosigma2,double **v3sigma3,double **v4rho4,
               double **v4rho3sigma,double **v4rho2sigma2,double **v4rhosigma3,double **v4sigma4)

{
  long lVar1;
  double **in_stack_ffffffffffffffc8;
  double **in_stack_ffffffffffffffd0;
  
  internal_counters_lda_prev
            (dim,offset,rho,zk,vrho,v2rho2,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
  lVar1 = (long)offset;
  if (*sigma != (double *)0x0) {
    *sigma = *sigma + -(dim->sigma + lVar1);
  }
  if (*vrho != (double *)0x0) {
    *vsigma = *vsigma + -(dim->vsigma + lVar1);
  }
  if (*v2rho2 != (double *)0x0) {
    *v2rhosigma = *v2rhosigma + -(dim->v2rhosigma + lVar1);
    *v2sigma2 = *v2sigma2 + -(dim->v2sigma2 + lVar1);
  }
  return;
}

Assistant:

GPU_FUNCTION void
internal_counters_gga_prev
(const xc_dimensions *dim, int offset, const double **rho, const double **sigma,
 double **zk GGA_OUT_PARAMS_NO_EXC(XC_COMMA double **, ))
{
  internal_counters_lda_prev(dim, offset, rho, zk LDA_OUT_PARAMS_NO_EXC(XC_COMMA, ));

  if(*sigma != NULL) *sigma -= dim->sigma  + offset;
#ifndef XC_DONT_COMPILE_VXC
  if(*vrho != NULL) *vsigma -= dim->vsigma + offset;
#ifndef XC_DONT_COMPILE_FXC
  if(*v2rho2 != NULL) {
    *v2rhosigma -= dim->v2rhosigma + offset;
    *v2sigma2   -= dim->v2sigma2  + offset;
  }
#ifndef XC_DONT_COMPILE_KXC
  if(*v3rho3 != NULL) {
    *v3rho2sigma -= dim->v3rho2sigma + offset;
    *v3rhosigma2 -= dim->v3rhosigma2 + offset;
    *v3sigma3    -= dim->v3sigma3    + offset;
  }
#ifndef XC_DONT_COMPILE_LXC
  if(*v4rho4 != NULL) {
    *v4rho3sigma  -= dim->v4rho3sigma  + offset;
    *v4rho2sigma2 -= dim->v4rho2sigma2 + offset;
    *v4rhosigma3  -= dim->v4rhosigma3  + offset;
    *v4sigma4     -= dim->v4sigma4     + offset;
  }
#endif
#endif
#endif
#endif
}